

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_SUMMON(effect_handler_context_t_conflict *context)

{
  short sVar1;
  int iVar2;
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  player *ppVar3;
  wchar_t type;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  monster_conflict *pmVar9;
  char *pcVar10;
  wchar_t temp_1;
  wchar_t temp;
  wchar_t rlev;
  monster *mon;
  wchar_t attempts;
  wchar_t val;
  wchar_t count;
  wchar_t fallback_type;
  wchar_t message_type;
  wchar_t level_boost;
  wchar_t summon_type;
  wchar_t summon_max;
  effect_handler_context_t_conflict *context_local;
  
  level_boost = effect_calculate_value(context,false);
  wVar7 = context->subtype;
  iVar2 = context->other;
  type = summon_message_type(wVar7);
  wVar4 = summon_fallback_type(wVar7);
  attempts = L'\0';
  mon._4_4_ = 0;
  mon._0_4_ = L'\0';
  sound(type);
  if ((player->upkeep->arena_level & 1U) == 0) {
    if ((context->origin).what == SRC_MONSTER) {
      pmVar9 = cave_monster(cave,(context->origin).which.monster);
      if (pmVar9 == (monster_conflict *)0x0) {
        __assert_fail("mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0x8d3,"_Bool effect_handler_SUMMON(effect_handler_context_t *)");
      }
      wVar5 = summon_name_to_idx("KIN");
      if (wVar7 == wVar5) {
        kin_base = pmVar9->race->base;
      }
      wVar5 = pmVar9->race->level;
      while (mon._4_4_ < player->depth * wVar5 && (wchar_t)mon < level_boost) {
        grid.x = (pmVar9->grid).x;
        grid.y = (pmVar9->grid).y;
        wVar6 = summon_specific(grid,wVar5 + iVar2,wVar7,false,false);
        mon._4_4_ = wVar6 * wVar6 + mon._4_4_;
        mon._0_4_ = (wchar_t)mon + L'\x01';
        if (0 < mon._4_4_) {
          attempts = attempts + L'\x01';
        }
      }
      if ((attempts == L'\0') && (L'\xffffffff' < wVar4)) {
        mon._0_4_ = L'\0';
        while (mon._4_4_ < player->depth * wVar5 && (wchar_t)mon < level_boost) {
          grid_00.x = (pmVar9->grid).x;
          grid_00.y = (pmVar9->grid).y;
          wVar7 = summon_specific(grid_00,wVar5 + iVar2,wVar4,false,false);
          mon._4_4_ = wVar7 * wVar7 + mon._4_4_;
          mon._0_4_ = (wchar_t)mon + L'\x01';
          if (0 < mon._4_4_) {
            attempts = attempts + L'\x01';
          }
        }
      }
      if (attempts == L'\0') {
        msg("But nothing comes.");
      }
    }
    else {
      for (; ppVar3 = player, level_boost != L'\0'; level_boost = level_boost + L'\xffffffff') {
        sVar1 = player->depth;
        uVar8 = Rand_div(4);
        grid_01.x = (ppVar3->grid).x;
        grid_01.y = (ppVar3->grid).y;
        wVar4 = summon_specific(grid_01,sVar1 + iVar2,wVar7,true,(_Bool)((uVar8 != 0 ^ 0xffU) & 1));
        attempts = wVar4 + attempts;
      }
    }
    context->ident = true;
    if ((attempts != L'\0') && (player->timed[2] != 0)) {
      pcVar10 = "something";
      if (L'\x01' < attempts) {
        pcVar10 = "many things";
      }
      msgt(type,"You hear %s appear nearby.",pcVar10);
    }
  }
  return true;
}

Assistant:

bool effect_handler_SUMMON(effect_handler_context_t *context)
{
	int summon_max = effect_calculate_value(context, false);
	int summon_type = context->subtype;
	int level_boost = context->other;
	int message_type = summon_message_type(summon_type);
	int fallback_type = summon_fallback_type(summon_type);
	int count = 0, val = 0, attempts = 0;

	sound(message_type);

	/* No summoning in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Monster summon */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		int rlev;

		assert(mon);

		/* Set the kin_base if necessary */
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Continue summoning until we reach the current dungeon level */
		rlev = mon->race->level;
		while ((val < player->depth * rlev) && (attempts < summon_max)) {
			int temp;

			/* Get a monster */
			temp = summon_specific(mon->grid, rlev + level_boost, summon_type,
								   false, false);

			val += temp * temp;

			/* Increase the attempt in case no monsters were available. */
			attempts++;

			/* Increase count of summoned monsters */
			if (val > 0)
				count++;
		}

		/* If the summon failed and there's a fallback type, use that */
		if ((count == 0) && (fallback_type >= 0)) {
			attempts = 0;
			while ((val < player->depth * rlev) && (attempts < summon_max)) {
				int temp;

				/* Get a monster */
				temp = summon_specific(mon->grid, rlev + level_boost,
									   fallback_type, false, false);

				val += temp * temp;

				/* Increase the attempt in case no monsters were available. */
				attempts++;

				/* Increase count of summoned monsters */
				if (val > 0)
					count++;
			}
		}

		/* Summoner failed */
		if (!count)
			msg("But nothing comes.");
	} else {
		/* If not a monster summon, it's simple */
		while (summon_max) {
			count += summon_specific(player->grid, player->depth + level_boost,
									 summon_type, true, one_in_(4));
			summon_max--;
		}
	}

	/* Identify */
	context->ident = true;

	/* Message for the blind */
	if (count && player->timed[TMD_BLIND])
		msgt(message_type, "You hear %s appear nearby.",
			 (count > 1 ? "many things" : "something"));

	return true;
}